

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall notch::core::FullyConnectedLayer::update(FullyConnectedLayer *this)

{
  element_type *peVar1;
  logic_error *this_00;
  
  peVar1 = (this->policy).
           super___shared_ptr<notch::core::ALearningPolicy,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (**peVar1->_vptr_ALearningPolicy)
              (peVar1,(this->weights).
                      super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (this->bias).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(this->weightSensitivity).
                      super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (this->biasSensitivity).
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"learning policy is not defined");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

virtual void update() {
        if (!policy) {
            throw std::logic_error("learning policy is not defined");
        }
        policy->update(*weights, *bias, *weightSensitivity, *biasSensitivity);
    }